

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O2

void fits_free_region(SAORegion *Rgn)

{
  long lVar1;
  RgnShape *__ptr;
  double *__ptr_00;
  void *__ptr_01;
  long lVar2;
  long lVar3;
  int iVar4;
  bool bVar5;
  int local_34;
  
  __ptr_01 = malloc(0x50);
  local_34 = 10;
  iVar4 = 0;
  for (lVar3 = 0; __ptr = Rgn->Shapes, lVar3 < Rgn->nShapes; lVar3 = lVar3 + 1) {
    if (__ptr[lVar3].shape == poly_rgn) {
      __ptr_00 = __ptr[lVar3].param.poly.Pts;
      if (__ptr[lVar3].sign == '\0') {
        lVar2 = 0;
        bVar5 = false;
        while ((lVar2 < iVar4 && (!bVar5))) {
          lVar1 = lVar2 * 8;
          lVar2 = lVar2 + 1;
          bVar5 = *(double **)((long)__ptr_01 + lVar1) == __ptr_00;
        }
        if (!bVar5) {
          free(__ptr_00);
          if (iVar4 == local_34) {
            local_34 = iVar4 * 2;
            __ptr_01 = realloc(__ptr_01,(long)local_34 << 3);
          }
          *(double **)((long)__ptr_01 + (long)iVar4 * 8) = __ptr_00;
          iVar4 = iVar4 + 1;
        }
      }
      else {
        free(__ptr_00);
      }
    }
  }
  free(__ptr);
  free(Rgn);
  free(__ptr_01);
  return;
}

Assistant:

void fits_free_region( SAORegion *Rgn )
/*   Free up memory allocated to hold the region data.                       
   This is more complicated for the case of polygons, which may be sharing
   points arrays due to shallow copying (in fits_set_region_components) of
   'exluded' regions.  We must ensure that these arrays are only freed once.       

/*---------------------------------------------------------------------------*/
{
   int i,j;
   
   int nFreedPoly=0;
   int nPolyArraySize=10;
   double **freedPolyPtrs=0;
   double *ptsToFree=0;
   int isAlreadyFreed=0;
   
   freedPolyPtrs = (double**)malloc(nPolyArraySize*sizeof(double*));

   for( i=0; i<Rgn->nShapes; i++ )
      if( Rgn->Shapes[i].shape == poly_rgn )
      {
         /* No shared arrays for 'include' polygons */
         if (Rgn->Shapes[i].sign)
            free(Rgn->Shapes[i].param.poly.Pts);
         else
         {
            ptsToFree = Rgn->Shapes[i].param.poly.Pts;
            isAlreadyFreed = 0;
            for (j=0; j<nFreedPoly && !isAlreadyFreed; j++)
            {
               if (freedPolyPtrs[j] == ptsToFree)
                  isAlreadyFreed = 1;
            }
            if (!isAlreadyFreed)
            {
               free(ptsToFree);
               /* Now add pointer to array of freed points */
               if (nFreedPoly == nPolyArraySize)
               {
                  nPolyArraySize *= 2;
                  freedPolyPtrs = (double **)realloc(freedPolyPtrs, 
                          nPolyArraySize*sizeof(double*));
               }
               freedPolyPtrs[nFreedPoly] = ptsToFree;
               ++nFreedPoly;
            }
         }
      }
   if( Rgn->Shapes )
      free( Rgn->Shapes );
   free( Rgn );
   
   free(freedPolyPtrs);
}